

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

node_t_conflict declaration_specs(c2m_ctx_t c2m_ctx,int no_err_p,node_t_conflict arg)

{
  parse_ctx *ppVar1;
  token_t ptVar2;
  undefined8 uVar3;
  parse_ctx *ppVar4;
  pos_t pVar5;
  pos_t p;
  int iVar6;
  node_t_conflict n;
  node_t_conflict op;
  node_t_conflict pnVar7;
  node_t_conflict pnVar8;
  char *pcVar9;
  node_t_conflict arg_00;
  bool bVar10;
  int local_70;
  pos_t local_40;
  
  ppVar1 = c2m_ctx->parse_ctx;
  ptVar2 = ppVar1->curr_token;
  pcVar9 = (ptVar2->pos).fname;
  uVar3._0_4_ = (ptVar2->pos).lno;
  uVar3._4_4_ = (ptVar2->pos).ln_pos;
  p = ptVar2->pos;
  n = new_node(c2m_ctx,N_LIST);
  bVar10 = arg != (node_t_conflict)0x0;
  local_70 = 0x28;
  pnVar8 = (node_t_conflict)0x0;
LAB_001638f0:
  do {
    ptVar2 = ppVar1->curr_token;
    pnVar7 = pnVar8;
    if (*(short *)ptVar2 == 0x113) {
      ppVar4 = c2m_ctx->parse_ctx;
      iVar6 = match(c2m_ctx,0x113,&local_40,(node_code_t *)0x0,(node_t_conflict *)0x0);
      if (iVar6 == 0) {
        if (ppVar4->record_level != 0) {
          return &err_struct;
        }
        local_70 = 0x113;
        goto LAB_00163b14;
      }
      iVar6 = match(c2m_ctx,0x28,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
      if (iVar6 == 0) {
        iVar6 = ppVar4->record_level;
      }
      else {
        pnVar8 = try_f(c2m_ctx,type_name);
        if ((pnVar8 == &err_struct) && (pnVar8 = cond_expr(c2m_ctx,no_err_p), pnVar8 == &err_struct)
           ) {
          return &err_struct;
        }
        iVar6 = match(c2m_ctx,0x29,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
        if (iVar6 != 0) {
          pVar5.lno = local_40.lno;
          pVar5.ln_pos = local_40.ln_pos;
          pVar5.fname = local_40.fname;
          op = new_pos_node1(c2m_ctx,N_ALIGNAS,pVar5,pnVar8);
          if (op == &err_struct) {
            return &err_struct;
          }
          goto LAB_00163a5c;
        }
        iVar6 = ppVar4->record_level;
        local_70 = 0x29;
      }
      if (iVar6 != 0) {
        return &err_struct;
      }
LAB_00163b14:
      pcVar9 = get_token_name(c2m_ctx,local_70);
      syntax_error(c2m_ctx,pcVar9);
      return &err_struct;
    }
    pVar5 = ptVar2->pos;
    op = try_f(c2m_ctx,sc_spec);
    if (((op != &err_struct) || (op = try_f(c2m_ctx,type_qual), op != &err_struct)) ||
       (op = try_f(c2m_ctx,func_spec), op != &err_struct)) {
LAB_00163a5c:
      op_append(c2m_ctx,n,op);
      bVar10 = true;
      pnVar8 = pnVar7;
      goto LAB_001638f0;
    }
    if (!bVar10) {
      op = type_spec(c2m_ctx,no_err_p,pnVar8);
      pnVar7 = op;
      if (op == &err_struct) {
        return &err_struct;
      }
      goto LAB_00163a5c;
    }
    op = try_arg_f(c2m_ctx,(nonterm_arg_func_t)pnVar8,arg_00);
    pnVar7 = op;
    if (op != &err_struct) goto LAB_00163a5c;
    pnVar7 = try_attr_spec(c2m_ctx,pVar5,(node_t_conflict *)0x0);
    if ((pnVar7 == &err_struct) || (bVar10 = true, pnVar7 == (node_t_conflict)0x0)) {
      if (pnVar8 == (node_t_conflict)0x0 && arg != (node_t_conflict)0x0) {
        if (c2m_ctx->options->pedantic_p != 0) {
          warning(c2m_ctx,0x18cba4,pcVar9,uVar3);
        }
        pnVar8 = new_pos_node(c2m_ctx,N_INT,p);
        op_append(c2m_ctx,n,pnVar8);
      }
      return n;
    }
  } while( true );
}

Assistant:

DA (declaration_specs) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t list, r, prev_type_spec = NULL;
  int first_p;
  pos_t pos = curr_token->pos, spec_pos;

  list = new_node (c2m_ctx, N_LIST);
  for (first_p = arg == NULL;; first_p = FALSE) {
    spec_pos = curr_token->pos;
    if (C (T_ALIGNAS)) {
      P (align_spec);
    } else if ((r = TRY (sc_spec)) != err_node) {
    } else if ((r = TRY (type_qual)) != err_node) {
    } else if ((r = TRY (func_spec)) != err_node) {
    } else if (first_p) {
      PA (type_spec, prev_type_spec);
      prev_type_spec = r;
    } else if ((r = TRY_A (type_spec, prev_type_spec)) != err_node) {
      prev_type_spec = r;
    } else if ((r = try_attr_spec (c2m_ctx, spec_pos, FALSE)) != err_node && r != NULL) {
      continue; /* ignore attrs for declaration specs (type attrs) */
    } else
      break;
    op_append (c2m_ctx, list, r);
  }
  if (prev_type_spec == NULL && arg != NULL) {
    if (c2m_options->pedantic_p) warning (c2m_ctx, pos, "type defaults to int");
    r = new_pos_node (c2m_ctx, N_INT, pos);
    op_append (c2m_ctx, list, r);
  }
  return list;
}